

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void * __thiscall mpt::array::insert(array *this,size_t off,size_t len,void *data)

{
  bool bVar1;
  buffer *pbVar2;
  type_traits *ptVar3;
  content *__s;
  size_t total;
  content *d;
  void *dest;
  void *data_local;
  size_t len_local;
  size_t off_local;
  array *this_local;
  
  d = (content *)0x0;
  pbVar2 = (buffer *)reference<mpt::array::content>::instance(&this->_buf);
  if (((pbVar2 != (buffer *)0x0) &&
      (ptVar3 = buffer::content_traits(pbVar2), ptVar3 == (type_traits *)0x0)) &&
     (bVar1 = buffer::shared(pbVar2), !bVar1)) {
    d = (content *)buffer::insert(pbVar2,off,len);
  }
  if (d == (content *)0x0) {
    pbVar2 = buffer::create(off + len,(type_traits *)0x0);
    if (pbVar2 == (buffer *)0x0) {
      return (void *)0x0;
    }
    d = (content *)buffer::insert(pbVar2,off,len);
    if (d == (content *)0x0) {
      (*pbVar2->_vptr_buffer[1])();
      return (void *)0x0;
    }
  }
  __s = d + off;
  if (data == (void *)0x0) {
    memset(__s,0,len);
  }
  else {
    memcpy(__s,data,len);
  }
  return __s;
}

Assistant:

void *array::insert(size_t off, size_t len, const void *data)
{
	void *dest = 0;
	content *d;
	
	/* compatibility check */
	if ((d = _buf.instance())
	 && !d->content_traits()
	 && !d->shared()) {
		dest = d->insert(off, len);
	}
	if (!dest) {
		size_t total = off + len;
		if (!(d = static_cast<content *>(buffer::create(total)))) {
			return 0;
		}
		if (!(dest = d->insert(off, len))) {
			d->unref();
			return 0;
		}
	}
	dest = static_cast<uint8_t *>(dest) + off;
	if (data) {
		memcpy(dest, data, len);
	} else {
		memset(dest, 0, len);
	}
	return dest;
}